

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O1

int __thiscall
Lib::List<Inferences::ALASCA::SuperpositionConf::Rhs>::remove
          (List<Inferences::ALASCA::SuperpositionConf::Rhs> *this,char *__filename)

{
  uint uVar1;
  List<Inferences::ALASCA::SuperpositionConf::Rhs> *this_00;
  List<Inferences::ALASCA::SuperpositionConf::Rhs> *pLVar2;
  List<Inferences::ALASCA::SuperpositionConf::Rhs> *this_01;
  Rhs local_70;
  
  if (__filename == (char *)0x0) {
    __filename = (char *)0x0;
  }
  else {
    head(&local_70,(List<Inferences::ALASCA::SuperpositionConf::Rhs> *)__filename);
    this_00 = *(List<Inferences::ALASCA::SuperpositionConf::Rhs> **)(__filename + 0x48);
    if ((((local_70.super_SelectedLiteral.cl)->super_Unit)._number !=
         (((this->_head).super_SelectedLiteral.cl)->super_Unit)._number) ||
       (local_70.super_SelectedLiteral.litIdx != (this->_head).super_SelectedLiteral.litIdx)) {
      if (this_00 == (List<Inferences::ALASCA::SuperpositionConf::Rhs> *)0x0) goto LAB_0038d6c0;
      head(&local_70,this_00);
      if (((local_70.super_SelectedLiteral.cl)->super_Unit)._number !=
          (((this->_head).super_SelectedLiteral.cl)->super_Unit)._number) goto LAB_0038d678;
      uVar1 = (this->_head).super_SelectedLiteral.litIdx;
      pLVar2 = (List<Inferences::ALASCA::SuperpositionConf::Rhs> *)__filename;
      this_01 = this_00;
      while (this_00 = this_01, local_70.super_SelectedLiteral.litIdx != uVar1) {
LAB_0038d678:
        do {
          pLVar2 = this_00;
          this_01 = pLVar2->_tail;
          if (this_01 == (List<Inferences::ALASCA::SuperpositionConf::Rhs> *)0x0) goto LAB_0038d6c0;
          head(&local_70,this_01);
          this_00 = this_01;
        } while (((local_70.super_SelectedLiteral.cl)->super_Unit)._number !=
                 (((this->_head).super_SelectedLiteral.cl)->super_Unit)._number);
        uVar1 = (this->_head).super_SelectedLiteral.litIdx;
      }
      pLVar2->_tail = this_01->_tail;
      this_00 = (List<Inferences::ALASCA::SuperpositionConf::Rhs> *)__filename;
      __filename = (char *)this_01;
    }
    operator_delete(__filename,8);
    __filename = (char *)this_00;
  }
LAB_0038d6c0:
  return (int)__filename;
}

Assistant:

static bool isEmpty (const List* l)
  {
    return l == 0;
  }